

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstylesheetstyle_p.cpp
# Opt level: O1

void QStyleSheetStyleCaches::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long in_FS_OFFSET;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      local_10 = *_a[1];
      QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
                ((QHash<void_const*,QCss::StyleSheet> *)(_o + 0x28),&local_10);
    }
    else if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        objectDestroyed((QStyleSheetStyleCaches *)_o,*_a[1]);
        return;
      }
      goto LAB_0036eff6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0036eff6:
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyleCaches::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QStyleSheetStyleCaches *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->objectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->styleDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
}